

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOptionCommand.cxx
# Opt level: O1

bool cmOptionCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  pointer pcVar1;
  string *psVar2;
  cmMakefile *this;
  pointer pbVar3;
  PolicyStatus PVar4;
  int iVar5;
  CacheEntryType CVar6;
  cmValue cVar7;
  cmState *pcVar8;
  PolicyID id;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  string_view separator;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string initialValue;
  undefined1 local_d0 [32];
  string local_b0;
  undefined1 local_90 [24];
  char *local_78;
  size_type local_70;
  pointer local_68;
  undefined1 *local_60;
  char *local_58;
  string local_50;
  
  uVar10 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffffc0;
  if (uVar10 == 0x40) {
    bVar12 = false;
    PVar4 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0077,false);
    cmMakefile::GetStateSnapshot(status->Makefile);
    cVar7 = cmStateSnapshot::GetDefinition
                      ((cmStateSnapshot *)local_90,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    if (PVar4 - NEW < 3) {
      bVar11 = cVar7.Value == (string *)0x0;
      bVar12 = false;
    }
    else {
      bVar11 = true;
      if (PVar4 == WARN) {
        local_90._0_8_ = cVar7;
        iVar5 = cmValue::Compare((cmValue *)local_90,(cmValue)0x0);
        bVar12 = iVar5 != 0;
      }
    }
    if (!bVar11) goto LAB_00340131;
    pcVar8 = cmMakefile::GetState(status->Makefile);
    cVar7 = cmState::GetCacheEntryValue
                      (pcVar8,(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start);
    if (cVar7.Value == (string *)0x0) {
LAB_0033ff30:
      local_d0._0_8_ = local_d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"Off","");
      pcVar9 = extraout_RDX_00;
LAB_0033ff51:
      if ((long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start == 0x60) {
        std::__cxx11::string::_M_assign((string *)local_d0);
        pcVar9 = extraout_RDX_01;
      }
      value._M_str = pcVar9;
      value._M_len = local_d0._0_8_;
      bVar11 = cmValue::IsOn((cmValue *)local_d0._8_8_,value);
      psVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pcVar9 = "OFF";
      if (bVar11) {
        pcVar9 = "ON";
      }
      cmMakefile::AddCacheDefinition
                (status->Makefile,psVar2,pcVar9,psVar2[1]._M_dataplus._M_p,BOOL,false);
      PVar4 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0077,false);
      if ((PVar4 != NEW) &&
         (PVar4 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0126,false), PVar4 == NEW)) {
        cmMakefile::GetStateSnapshot(status->Makefile);
        cmStateSnapshot::RemoveDefinition
                  ((cmStateSnapshot *)local_90,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
      }
      if (bVar12) {
        cmMakefile::GetStateSnapshot(status->Makefile);
        cVar7 = cmStateSnapshot::GetDefinition
                          ((cmStateSnapshot *)local_90,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start);
        if (cVar7.Value == (string *)0x0) {
          this = status->Makefile;
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_50,(cmPolicies *)0x4d,id);
          pbVar3 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_90._0_8_ = local_50._M_string_length;
          local_90._8_8_ = local_50._M_dataplus._M_p;
          local_90._16_8_ = 0x59;
          local_78 = 
          "\nFor compatibility with older versions of CMake, option is clearing the normal variable \'"
          ;
          local_68 = (pbVar3->_M_dataplus)._M_p;
          local_70 = pbVar3->_M_string_length;
          local_60 = &DAT_00000002;
          local_58 = "\'.";
          views_00._M_len = 4;
          views_00._M_array = (iterator)local_90;
          cmCatViews_abi_cxx11_(&local_b0,views_00);
          cmMakefile::IssueMessage(this,AUTHOR_WARNING,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
      }
      goto LAB_0033fe8d;
    }
    CVar6 = cmState::GetCacheEntryType
                      (pcVar8,(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start);
    if (CVar6 == UNINITIALIZED) {
      if (cVar7.Value == (string *)0x0) goto LAB_0033ff30;
      local_d0._0_8_ = local_d0 + 0x10;
      pcVar1 = ((cVar7.Value)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_d0,pcVar1,pcVar1 + (cVar7.Value)->_M_string_length);
      pcVar9 = extraout_RDX;
      goto LAB_0033ff51;
    }
    psVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_90._0_8_ = (cmState *)(local_90 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"HELPSTRING","");
    cmState::SetCacheEntryProperty
              (pcVar8,psVar2,(string *)local_90,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1);
    local_d0._16_8_ = local_90._16_8_;
    pcVar8 = (cmState *)local_90._0_8_;
    if ((cmState *)local_90._0_8_ == (cmState *)(local_90 + 0x10)) goto LAB_00340131;
  }
  else {
    separator._M_str = " ";
    separator._M_len = 1;
    cmJoin(&local_b0,args,separator,(string_view)ZEXT816(0));
    local_90._0_8_ = (cmState *)0x2b;
    local_90._8_8_ = "called with incorrect number of arguments: ";
    local_90._16_8_ = local_b0._M_string_length;
    local_78 = local_b0._M_dataplus._M_p;
    views._M_len = 2;
    views._M_array = (iterator)local_90;
    cmCatViews_abi_cxx11_((string *)local_d0,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0033fe8d:
    pcVar8 = (cmState *)local_d0._0_8_;
    if ((cmState *)local_d0._0_8_ == (cmState *)(local_d0 + 0x10)) goto LAB_00340131;
  }
  operator_delete(pcVar8,local_d0._16_8_ + 1);
LAB_00340131:
  return uVar10 == 0x40;
}

Assistant:

bool cmOptionCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  const bool argError = (args.size() < 2) || (args.size() > 3);
  if (argError) {
    std::string m = cmStrCat("called with incorrect number of arguments: ",
                             cmJoin(args, " "));
    status.SetError(m);
    return false;
  }

  // Determine the state of the option policy
  bool checkAndWarn = false;
  {
    auto policyStatus =
      status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0077);
    const auto& existsBeforeSet =
      status.GetMakefile().GetStateSnapshot().GetDefinition(args[0]);
    switch (policyStatus) {
      case cmPolicies::WARN:
        checkAndWarn = (existsBeforeSet != nullptr);
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior does not warn.
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW: {
        // See if a local variable with this name already exists.
        // If so we ignore the option command.
        if (existsBeforeSet) {
          return true;
        }
      } break;
    }
  }

  // See if a cache variable with this name already exists
  // If so just make sure the doc state is correct
  cmState* state = status.GetMakefile().GetState();
  cmValue existingValue = state->GetCacheEntryValue(args[0]);
  if (existingValue &&
      (state->GetCacheEntryType(args[0]) != cmStateEnums::UNINITIALIZED)) {
    state->SetCacheEntryProperty(args[0], "HELPSTRING", args[1]);
    return true;
  }

  // Nothing in the cache so add it
  std::string initialValue = existingValue ? *existingValue : "Off";
  if (args.size() == 3) {
    initialValue = args[2];
  }
  bool init = cmIsOn(initialValue);
  status.GetMakefile().AddCacheDefinition(args[0], init ? "ON" : "OFF",
                                          args[1].c_str(), cmStateEnums::BOOL);
  if (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0077) !=
        cmPolicies::NEW &&
      status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0126) ==
        cmPolicies::NEW) {
    // if there was a definition then remove it
    status.GetMakefile().GetStateSnapshot().RemoveDefinition(args[0]);
  }

  if (checkAndWarn) {
    const auto& existsAfterSet =
      status.GetMakefile().GetStateSnapshot().GetDefinition(args[0]);
    if (!existsAfterSet) {
      status.GetMakefile().IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0077),
                 "\n"
                 "For compatibility with older versions of CMake, option "
                 "is clearing the normal variable '",
                 args[0], "'."));
    }
  }
  return true;
}